

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor_unittest.cc
# Opt level: O0

void __thiscall
google::protobuf::descriptor_unittest::CopySourceCodeInfoToTest_CopySourceCodeInfoTo_Test::TestBody
          (CopySourceCodeInfoToTest_CopySourceCodeInfoTo_Test *this)

{
  bool bVar1;
  char *pcVar2;
  char *in_R9;
  AssertHelper local_2d8;
  Message local_2d0;
  int32_t local_2c8;
  int local_2c4;
  undefined1 local_2c0 [8];
  AssertionResult gtest_ar_7;
  Message local_2a8;
  int32_t local_2a0;
  int local_29c;
  undefined1 local_298 [8];
  AssertionResult gtest_ar_6;
  Message local_280;
  int32_t local_278;
  int local_274;
  undefined1 local_270 [8];
  AssertionResult gtest_ar_5;
  Message local_258;
  int local_250 [2];
  undefined1 local_248 [8];
  AssertionResult gtest_ar_4;
  Message local_230;
  int32_t local_228;
  int local_224;
  undefined1 local_220 [8];
  AssertionResult gtest_ar_3;
  Message local_208;
  int32_t local_200 [2];
  undefined1 local_1f8 [8];
  AssertionResult gtest_ar_2;
  Message local_1e0;
  int local_1d8 [2];
  undefined1 local_1d0 [8];
  AssertionResult gtest_ar_1;
  SourceCodeInfo_Location *foo_location;
  Message local_1b0;
  int local_1a8 [2];
  undefined1 local_1a0 [8];
  AssertionResult gtest_ar;
  SourceCodeInfo *info;
  string local_180;
  AssertHelper local_160;
  Message local_158 [3];
  bool local_139;
  undefined1 local_138 [8];
  AssertionResult gtest_ar_;
  FileDescriptorProto file_desc_proto;
  FileDescriptor *local_20;
  FileDescriptor *local_18;
  FileDescriptor *file_desc;
  CopySourceCodeInfoToTest_CopySourceCodeInfoTo_Test *this_local;
  
  file_desc = (FileDescriptor *)this;
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
            ((basic_string_view<char,_std::char_traits<char>_> *)
             ((long)&file_desc_proto.field_0 + 0xe0),"/test/test.proto");
  local_20 = DescriptorPool::FindFileByName
                       (&(this->super_CopySourceCodeInfoToTest).pool_,stack0xffffffffffffffd0);
  local_18 = absl::lts_20250127::log_internal::DieIfNull<google::protobuf::FileDescriptor_const*>
                       ("/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/descriptor_unittest.cc"
                        ,0x3940,"pool_.FindFileByName(\"/test/test.proto\")",&local_20);
  FileDescriptorProto::FileDescriptorProto((FileDescriptorProto *)&gtest_ar_.message_);
  bVar1 = FileDescriptorProto::has_source_code_info((FileDescriptorProto *)&gtest_ar_.message_);
  local_139 = (bool)(~bVar1 & 1);
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)local_138,&local_139,(type *)0x0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_138);
  if (!bVar1) {
    testing::Message::Message(local_158);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (&local_180,(internal *)local_138,
               (AssertionResult *)"file_desc_proto.has_source_code_info()","true","false",in_R9);
    pcVar2 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_160,kFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/descriptor_unittest.cc"
               ,0x3942,pcVar2);
    testing::internal::AssertHelper::operator=(&local_160,local_158);
    testing::internal::AssertHelper::~AssertHelper(&local_160);
    std::__cxx11::string::~string((string *)&local_180);
    testing::Message::~Message(local_158);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_138);
  if (bVar1) {
    FileDescriptor::CopySourceCodeInfoTo(local_18,(FileDescriptorProto *)&gtest_ar_.message_);
    gtest_ar.message_._M_t.
    super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_t.
    super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    .
    super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
    ._M_head_impl =
         (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
          )FileDescriptorProto::source_code_info((FileDescriptorProto *)&gtest_ar_.message_);
    local_1a8[1] = 4;
    local_1a8[0] = SourceCodeInfo::location_size
                             ((SourceCodeInfo *)
                              gtest_ar.message_._M_t.
                              super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              ._M_t.
                              super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              .
                              super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                              ._M_head_impl);
    testing::internal::EqHelper::Compare<int,_int,_nullptr>
              ((EqHelper *)local_1a0,"4","info.location_size()",local_1a8 + 1,local_1a8);
    bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_1a0);
    if (!bVar1) {
      testing::Message::Message(&local_1b0);
      pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_1a0);
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)&foo_location,kFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/descriptor_unittest.cc"
                 ,0x3946,pcVar2);
      testing::internal::AssertHelper::operator=((AssertHelper *)&foo_location,&local_1b0);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&foo_location);
      testing::Message::~Message(&local_1b0);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)local_1a0);
    if (bVar1) {
      gtest_ar_1.message_._M_t.
      super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_t.
      super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      .
      super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
      ._M_head_impl =
           (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
            )SourceCodeInfo::location
                       ((SourceCodeInfo *)
                        gtest_ar.message_._M_t.
                        super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        ._M_t.
                        super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        .
                        super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                        ._M_head_impl,2);
      local_1d8[1] = 2;
      local_1d8[0] = SourceCodeInfo_Location::path_size
                               ((SourceCodeInfo_Location *)
                                gtest_ar_1.message_._M_t.
                                super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                ._M_t.
                                super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                .
                                super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                ._M_head_impl);
      testing::internal::EqHelper::Compare<int,_int,_nullptr>
                ((EqHelper *)local_1d0,"2","foo_location.path_size()",local_1d8 + 1,local_1d8);
      bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_1d0);
      if (!bVar1) {
        testing::Message::Message(&local_1e0);
        pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_1d0);
        testing::internal::AssertHelper::AssertHelper
                  ((AssertHelper *)&gtest_ar_2.message_,kFatalFailure,
                   "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/descriptor_unittest.cc"
                   ,0x3949,pcVar2);
        testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_2.message_,&local_1e0);
        testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_2.message_);
        testing::Message::~Message(&local_1e0);
      }
      testing::AssertionResult::~AssertionResult((AssertionResult *)local_1d0);
      if (bVar1) {
        local_200[1] = 4;
        local_200[0] = SourceCodeInfo_Location::path
                                 ((SourceCodeInfo_Location *)
                                  gtest_ar_1.message_._M_t.
                                  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                  ._M_t.
                                  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                  .
                                  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                  ._M_head_impl,0);
        testing::internal::EqHelper::
        Compare<google::protobuf::FileDescriptorProto::(unnamed_enum_at__workspace_llm4binary_github_license_c_cmakelists_protocolbuffers[P]protobuf_src_google_protobuf_descriptor_pb_h:11873:3),_int,_nullptr>
                  ((EqHelper *)local_1f8,"FileDescriptorProto::kMessageTypeFieldNumber",
                   "foo_location.path(0)",(anon_enum_32 *)(local_200 + 1),local_200);
        bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_1f8);
        if (!bVar1) {
          testing::Message::Message(&local_208);
          pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_1f8);
          testing::internal::AssertHelper::AssertHelper
                    ((AssertHelper *)&gtest_ar_3.message_,kNonFatalFailure,
                     "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/descriptor_unittest.cc"
                     ,0x394a,pcVar2);
          testing::internal::AssertHelper::operator=
                    ((AssertHelper *)&gtest_ar_3.message_,&local_208);
          testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_3.message_);
          testing::Message::~Message(&local_208);
        }
        testing::AssertionResult::~AssertionResult((AssertionResult *)local_1f8);
        local_224 = 0;
        local_228 = SourceCodeInfo_Location::path
                              ((SourceCodeInfo_Location *)
                               gtest_ar_1.message_._M_t.
                               super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                               ._M_t.
                               super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                               .
                               super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                               ._M_head_impl,1);
        testing::internal::EqHelper::Compare<int,_int,_nullptr>
                  ((EqHelper *)local_220,"0","foo_location.path(1)",&local_224,&local_228);
        bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_220);
        if (!bVar1) {
          testing::Message::Message(&local_230);
          pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_220);
          testing::internal::AssertHelper::AssertHelper
                    ((AssertHelper *)&gtest_ar_4.message_,kNonFatalFailure,
                     "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/descriptor_unittest.cc"
                     ,0x394b,pcVar2);
          testing::internal::AssertHelper::operator=
                    ((AssertHelper *)&gtest_ar_4.message_,&local_230);
          testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_4.message_);
          testing::Message::~Message(&local_230);
        }
        testing::AssertionResult::~AssertionResult((AssertionResult *)local_220);
        local_250[1] = 3;
        local_250[0] = SourceCodeInfo_Location::span_size
                                 ((SourceCodeInfo_Location *)
                                  gtest_ar_1.message_._M_t.
                                  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                  ._M_t.
                                  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                  .
                                  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                  ._M_head_impl);
        testing::internal::EqHelper::Compare<int,_int,_nullptr>
                  ((EqHelper *)local_248,"3","foo_location.span_size()",local_250 + 1,local_250);
        bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_248);
        if (!bVar1) {
          testing::Message::Message(&local_258);
          pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_248);
          testing::internal::AssertHelper::AssertHelper
                    ((AssertHelper *)&gtest_ar_5.message_,kFatalFailure,
                     "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/descriptor_unittest.cc"
                     ,0x394c,pcVar2);
          testing::internal::AssertHelper::operator=
                    ((AssertHelper *)&gtest_ar_5.message_,&local_258);
          testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_5.message_);
          testing::Message::~Message(&local_258);
        }
        testing::AssertionResult::~AssertionResult((AssertionResult *)local_248);
        if (bVar1) {
          local_274 = 1;
          local_278 = SourceCodeInfo_Location::span
                                ((SourceCodeInfo_Location *)
                                 gtest_ar_1.message_._M_t.
                                 super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                 ._M_t.
                                 super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                 .
                                 super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                 ._M_head_impl,0);
          testing::internal::EqHelper::Compare<int,_int,_nullptr>
                    ((EqHelper *)local_270,"1","foo_location.span(0)",&local_274,&local_278);
          bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_270);
          if (!bVar1) {
            testing::Message::Message(&local_280);
            pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_270);
            testing::internal::AssertHelper::AssertHelper
                      ((AssertHelper *)&gtest_ar_6.message_,kNonFatalFailure,
                       "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/descriptor_unittest.cc"
                       ,0x394d,pcVar2);
            testing::internal::AssertHelper::operator=
                      ((AssertHelper *)&gtest_ar_6.message_,&local_280);
            testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_6.message_);
            testing::Message::~Message(&local_280);
          }
          testing::AssertionResult::~AssertionResult((AssertionResult *)local_270);
          local_29c = 0;
          local_2a0 = SourceCodeInfo_Location::span
                                ((SourceCodeInfo_Location *)
                                 gtest_ar_1.message_._M_t.
                                 super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                 ._M_t.
                                 super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                 .
                                 super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                 ._M_head_impl,1);
          testing::internal::EqHelper::Compare<int,_int,_nullptr>
                    ((EqHelper *)local_298,"0","foo_location.span(1)",&local_29c,&local_2a0);
          bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_298);
          if (!bVar1) {
            testing::Message::Message(&local_2a8);
            pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_298);
            testing::internal::AssertHelper::AssertHelper
                      ((AssertHelper *)&gtest_ar_7.message_,kNonFatalFailure,
                       "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/descriptor_unittest.cc"
                       ,0x394e,pcVar2);
            testing::internal::AssertHelper::operator=
                      ((AssertHelper *)&gtest_ar_7.message_,&local_2a8);
            testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_7.message_);
            testing::Message::~Message(&local_2a8);
          }
          testing::AssertionResult::~AssertionResult((AssertionResult *)local_298);
          local_2c4 = 0xe;
          local_2c8 = SourceCodeInfo_Location::span
                                ((SourceCodeInfo_Location *)
                                 gtest_ar_1.message_._M_t.
                                 super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                 ._M_t.
                                 super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                 .
                                 super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                 ._M_head_impl,2);
          testing::internal::EqHelper::Compare<int,_int,_nullptr>
                    ((EqHelper *)local_2c0,"14","foo_location.span(2)",&local_2c4,&local_2c8);
          bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_2c0);
          if (!bVar1) {
            testing::Message::Message(&local_2d0);
            pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_2c0);
            testing::internal::AssertHelper::AssertHelper
                      (&local_2d8,kNonFatalFailure,
                       "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/descriptor_unittest.cc"
                       ,0x394f,pcVar2);
            testing::internal::AssertHelper::operator=(&local_2d8,&local_2d0);
            testing::internal::AssertHelper::~AssertHelper(&local_2d8);
            testing::Message::~Message(&local_2d0);
          }
          testing::AssertionResult::~AssertionResult((AssertionResult *)local_2c0);
        }
      }
    }
  }
  FileDescriptorProto::~FileDescriptorProto((FileDescriptorProto *)&gtest_ar_.message_);
  return;
}

Assistant:

TEST_F(CopySourceCodeInfoToTest, CopySourceCodeInfoTo) {
  const FileDescriptor* file_desc =
      ABSL_DIE_IF_NULL(pool_.FindFileByName("/test/test.proto"));
  FileDescriptorProto file_desc_proto;
  ASSERT_FALSE(file_desc_proto.has_source_code_info());

  file_desc->CopySourceCodeInfoTo(&file_desc_proto);
  const SourceCodeInfo& info = file_desc_proto.source_code_info();
  ASSERT_EQ(4, info.location_size());
  // Get the Foo message location
  const SourceCodeInfo_Location& foo_location = info.location(2);
  ASSERT_EQ(2, foo_location.path_size());
  EXPECT_EQ(FileDescriptorProto::kMessageTypeFieldNumber, foo_location.path(0));
  EXPECT_EQ(0, foo_location.path(1));      // Foo is the first message defined
  ASSERT_EQ(3, foo_location.span_size());  // Foo spans one line
  EXPECT_EQ(1, foo_location.span(0));      // Foo is declared on line 1
  EXPECT_EQ(0, foo_location.span(1));      // Foo starts at column 0
  EXPECT_EQ(14, foo_location.span(2));     // Foo ends on column 14
}